

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTConstructCallAction_UnloadEventMemory
               (EventLogEntry *evt,UnlinkableSlabAllocator *alloc)

{
  if (evt->EventKind != ConstructCallActionTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  if (*(void **)(evt + 2) != (void *)0x0) {
    SlabAllocatorBase<8>::UnlinkAllocation(alloc,*(void **)(evt + 2));
  }
  if ((void *)evt[2].EventTimeStamp != (void *)0x0) {
    SlabAllocatorBase<8>::UnlinkAllocation(alloc,(void *)evt[2].EventTimeStamp);
    return;
  }
  return;
}

Assistant:

void JsRTConstructCallAction_UnloadEventMemory(EventLogEntry* evt, UnlinkableSlabAllocator& alloc)
        {
            JsRTConstructCallAction* ccAction = GetInlineEventDataAs<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(evt);

            if(ccAction->ArgArray != nullptr)
            {
                alloc.UnlinkAllocation(ccAction->ArgArray);
            }

            if(ccAction->ExecArgs != nullptr)
            {
                alloc.UnlinkAllocation(ccAction->ExecArgs);
            }
        }